

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O3

void GPU_PushMatrix(void)

{
  uint *puVar1;
  GPU_Context *pGVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  GPU_Target *pGVar16;
  float **ppfVar17;
  float *pfVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  
  pGVar16 = GPU_GetContextTarget();
  if ((pGVar16 != (GPU_Target *)0x0) && (pGVar2 = pGVar16->context, pGVar2 != (GPU_Context *)0x0)) {
    bVar21 = pGVar2->matrix_mode == 0;
    uVar19 = (&pGVar2->projection_matrix)[bVar21].storage_size;
    uVar15 = (&pGVar2->projection_matrix)[bVar21].size;
    if (uVar15 + 1 < uVar19) {
      ppfVar17 = (&pGVar2->projection_matrix)[bVar21].matrix;
    }
    else {
      uVar19 = uVar19 * 2 + 4;
      ppfVar17 = (float **)SDL_malloc((ulong)uVar19 * 8);
      if (uVar19 != 0) {
        uVar20 = 0;
        do {
          pfVar18 = (float *)SDL_malloc(0x40);
          ppfVar17[uVar20] = pfVar18;
          uVar20 = uVar20 + 1;
        } while (uVar19 != uVar20);
      }
      if ((&pGVar2->projection_matrix)[bVar21].size != 0) {
        uVar20 = 0;
        do {
          pfVar18 = ppfVar17[uVar20];
          pfVar3 = (&pGVar2->projection_matrix)[bVar21].matrix[uVar20];
          fVar4 = *pfVar3;
          fVar5 = pfVar3[1];
          fVar6 = pfVar3[2];
          fVar7 = pfVar3[3];
          uVar8 = *(undefined8 *)(pfVar3 + 4);
          uVar9 = *(undefined8 *)(pfVar3 + 6);
          uVar10 = *(undefined8 *)(pfVar3 + 8);
          uVar11 = *(undefined8 *)(pfVar3 + 10);
          uVar12 = *(undefined8 *)(pfVar3 + 0xe);
          *(undefined8 *)(pfVar18 + 0xc) = *(undefined8 *)(pfVar3 + 0xc);
          *(undefined8 *)(pfVar18 + 0xe) = uVar12;
          *(undefined8 *)(pfVar18 + 8) = uVar10;
          *(undefined8 *)(pfVar18 + 10) = uVar11;
          *(undefined8 *)(pfVar18 + 4) = uVar8;
          *(undefined8 *)(pfVar18 + 6) = uVar9;
          *pfVar18 = fVar4;
          pfVar18[1] = fVar5;
          pfVar18[2] = fVar6;
          pfVar18[3] = fVar7;
          uVar20 = uVar20 + 1;
        } while (uVar20 < (&pGVar2->projection_matrix)[bVar21].size);
      }
      if ((&pGVar2->projection_matrix)[bVar21].storage_size != 0) {
        uVar20 = 0;
        do {
          SDL_free((&pGVar2->projection_matrix)[bVar21].matrix[uVar20]);
          uVar20 = uVar20 + 1;
        } while (uVar20 < (&pGVar2->projection_matrix)[bVar21].storage_size);
      }
      SDL_free((&pGVar2->projection_matrix)[bVar21].matrix);
      (&pGVar2->projection_matrix)[bVar21].storage_size = uVar19;
      (&pGVar2->projection_matrix)[bVar21].matrix = ppfVar17;
      uVar15 = (&pGVar2->projection_matrix)[bVar21].size;
    }
    pfVar18 = ppfVar17[uVar15];
    pfVar3 = ppfVar17[uVar15 - 1];
    uVar8 = *(undefined8 *)pfVar3;
    uVar9 = *(undefined8 *)(pfVar3 + 2);
    uVar10 = *(undefined8 *)(pfVar3 + 4);
    uVar11 = *(undefined8 *)(pfVar3 + 6);
    uVar12 = *(undefined8 *)(pfVar3 + 8);
    uVar13 = *(undefined8 *)(pfVar3 + 10);
    uVar14 = *(undefined8 *)(pfVar3 + 0xe);
    *(undefined8 *)(pfVar18 + 0xc) = *(undefined8 *)(pfVar3 + 0xc);
    *(undefined8 *)(pfVar18 + 0xe) = uVar14;
    *(undefined8 *)(pfVar18 + 8) = uVar12;
    *(undefined8 *)(pfVar18 + 10) = uVar13;
    *(undefined8 *)(pfVar18 + 4) = uVar10;
    *(undefined8 *)(pfVar18 + 6) = uVar11;
    *(undefined8 *)pfVar18 = uVar8;
    *(undefined8 *)(pfVar18 + 2) = uVar9;
    puVar1 = &(&pGVar2->projection_matrix)[bVar21].size;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void GPU_PushMatrix(void)
{
    GPU_Target* target = GPU_GetContextTarget();
	GPU_MatrixStack* stack;

    if(target == NULL || target->context == NULL)
        return;
    
    stack = (target->context->matrix_mode == GPU_MODELVIEW? &target->context->modelview_matrix : &target->context->projection_matrix);
    if(stack->size + 1 >= stack->storage_size)
    {
        // Grow matrix stack (1, 6, 16, 36, ...)
        
        // Alloc new one
        unsigned int new_storage_size = stack->storage_size*2 + 4;
        float** new_stack = (float**)SDL_malloc(sizeof(float*) * new_storage_size);
        unsigned int i;
        for(i = 0; i < new_storage_size; ++i)
        {
            new_stack[i] = (float*)SDL_malloc(sizeof(float) * 16);
        }
        // Copy old one
        for(i = 0; i < stack->size; ++i)
        {
            GPU_MatrixCopy(new_stack[i], stack->matrix[i]);
        }
        // Free old one
        for(i = 0; i < stack->storage_size; ++i)
        {
            SDL_free(stack->matrix[i]);
        }
        SDL_free(stack->matrix);
        
        // Switch to new one
        stack->storage_size = new_storage_size;
        stack->matrix = new_stack;
    }
    GPU_MatrixCopy(stack->matrix[stack->size], stack->matrix[stack->size-1]);
    stack->size++;
}